

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingAdaptedStructs.cpp
# Opt level: O1

int main(void)

{
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined5 uVar5;
  atomic<unsigned_long> aVar6;
  int iVar7;
  cx_string<7UL> cVar8;
  size_t sVar9;
  Session *pSVar10;
  undefined8 uVar11;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  long lVar12;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  ulong uVar13;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_08;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_09;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_10;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_11;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_12;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_13;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_14;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_15;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_16;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_17;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_18;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_19;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_20;
  SessionWriter *this;
  char *__end;
  long lVar14;
  long *in_FS_OFFSET;
  cx_string<12UL> cVar15;
  cx_string<15UL> cVar16;
  timespec ts;
  undefined1 local_7d8 [8];
  int iStack_7d0;
  undefined1 uStack_7cc;
  undefined2 uStack_7cb;
  undefined1 uStack_7c9;
  undefined1 local_7c8 [32];
  Private local_7a8;
  undefined1 uStack_7a0;
  undefined4 uStack_79f;
  undefined2 uStack_79b;
  undefined1 uStack_799;
  char local_798;
  uint uStack_797;
  undefined2 uStack_791;
  uint local_78f;
  undefined1 local_78b;
  undefined1 uStack_78a;
  undefined1 local_789;
  SessionWriter *local_788;
  cx_string<1UL> local_77c;
  cx_string<1UL> local_77a;
  Private local_778;
  undefined8 uStack_770;
  undefined2 local_768;
  undefined1 local_766;
  undefined1 local_760 [16];
  _Alloc_hider local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  uint64_t local_6f0;
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  undefined1 local_6a8 [16];
  _Alloc_hider local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  _Alloc_hider local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  uint64_t local_638;
  _Alloc_hider local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [16];
  _Alloc_hider local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  _Alloc_hider local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  uint64_t local_580;
  _Alloc_hider local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  undefined1 local_538 [16];
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  uint64_t local_4c8;
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined1 local_480 [16];
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  uint64_t local_410;
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uint64_t local_358;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [16];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  uint64_t local_2a0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  uint64_t local_1e8;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar10 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
    main_cold_1();
    in_RDX = extraout_RDX_11;
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (0x80 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
LAB_00102f9b:
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_4();
      in_RDX = extraout_RDX_12;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_5();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_310._0_8_ = 0;
        local_310._8_2_ = info;
        local_300._M_p = (pointer)&local_2f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"main","");
        local_2e0._M_p = (pointer)&local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"main","");
        local_2c0._M_p = (pointer)&local_2b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_2a0 = 0x5c;
        local_298._M_p = (pointer)&local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"{}","");
        local_7a8.a = 0x6e69537b;
        local_7a8.b = 0x656c67;
        local_778.a = 0x276160;
        local_77a._data[0] = 'i';
        local_77a._data[1] = '\0';
        local_77c._data[0] = '}';
        local_77c._data[1] = '\0';
        cVar15 = mserialize::cx_strcat<7ul,3ul,1ul,1ul>
                           ((cx_string<7UL> *)&local_7a8,(cx_string<3UL> *)&local_778,&local_77a,
                            &local_77c);
        local_7d8 = cVar15._data._0_8_;
        iStack_7d0 = cVar15._data._8_4_;
        uStack_7cc = 0;
        local_278._M_p = (pointer)&local_268;
        sVar9 = strlen(local_7d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_7d8,local_7d8 + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_0010505b;
        local_310._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_310,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_p != &local_2b0) {
          operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_p != &local_2d0) {
          operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_p != &local_2f0) {
          operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_6();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar12 = (long)local_7d8 * 1000000000;
      local_7d8._0_4_ = 0x7b;
      binlog::SessionWriter::addEvent<Single>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 lVar12 + CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
                 (Single *)local_7d8);
      in_RDX = extraout_RDX_00;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_7();
      in_RDX = extraout_RDX_13;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_8();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_3c8._0_8_ = 0;
        local_3c8._8_2_ = info;
        local_3b8._M_p = (pointer)&local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"main","");
        local_398._M_p = (pointer)&local_388;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"main","");
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_378,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_358 = 0x5f;
        local_350._M_p = (pointer)&local_340;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"{}","");
        local_7d8._0_4_ = 2;
        puVar3 = local_7c8 + 8;
        iStack_7d0 = (int)puVar3;
        uStack_7cc = (undefined1)((ulong)puVar3 >> 0x20);
        uStack_7cb = (undefined2)((ulong)puVar3 >> 0x28);
        uStack_7c9 = (undefined1)((ulong)puVar3 >> 0x38);
        std::__cxx11::string::_M_construct<char_const*>((string *)&iStack_7d0,"three","");
        cVar16 = mserialize::CustomTag<Pair,_void>::tag_string();
        local_7a8 = cVar16._data._0_8_;
        uVar13 = cVar16._data._8_8_ & 0xffffffffffffff;
        uStack_7a0 = (undefined1)uVar13;
        uStack_79f = (undefined4)(uVar13 >> 8);
        uStack_79b = (undefined2)(uVar13 >> 0x28);
        uStack_799 = 0;
        local_330._M_p = (pointer)&local_320;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105062;
        local_3c8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_3c8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_p != &local_340) {
          operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
        }
        puVar3 = (undefined1 *)
                 CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
        if (puVar3 != local_7c8 + 8) {
          operator_delete(puVar3,CONCAT17(local_7c8[0xf],
                                          CONCAT25(local_7c8._13_2_,
                                                   CONCAT41(local_7c8._9_4_,local_7c8[8]))) + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_9();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar14 = (long)local_7d8 * 1000000000;
      lVar12 = CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
      local_7d8._0_4_ = 2;
      puVar3 = local_7c8 + 8;
      iStack_7d0 = (int)puVar3;
      uStack_7cc = (undefined1)((ulong)puVar3 >> 0x20);
      uStack_7cb = (undefined2)((ulong)puVar3 >> 0x28);
      uStack_7c9 = (undefined1)((ulong)puVar3 >> 0x38);
      std::__cxx11::string::_M_construct<char_const*>((string *)&iStack_7d0,"three","");
      binlog::SessionWriter::addEvent<Pair>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,lVar14 + lVar12,
                 (Pair *)local_7d8);
      puVar4 = (undefined1 *)
               CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
      in_RDX = extraout_RDX_01;
      if (puVar4 != puVar3) {
        operator_delete(puVar4,CONCAT17(local_7c8[0xf],
                                        CONCAT25(local_7c8._13_2_,
                                                 CONCAT41(local_7c8._9_4_,local_7c8[8]))) + 1);
        in_RDX = extraout_RDX_02;
      }
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_10();
      in_RDX = extraout_RDX_14;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_11();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_480._0_8_ = 0;
        local_480._8_2_ = info;
        local_470._M_p = (pointer)&local_460;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"main","");
        local_450._M_p = (pointer)&local_440;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"main","");
        local_430._M_p = (pointer)&local_420;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_410 = 0x62;
        local_408._M_p = (pointer)&local_3f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"{}","");
        mserialize::CustomTag<Getter,_void>::tag_string();
        uStack_797 = uStack_797 & 0xffffff00;
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79f = (undefined4)(CONCAT14(uStack_7cc,iStack_7d0) >> 8);
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        local_3e8._M_p = (pointer)&local_3d8;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3e8,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105069;
        local_480._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_480,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_p != &local_3d8) {
          operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_p != &local_3f8) {
          operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_p != &local_420) {
          operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_p != &local_440) {
          operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_p != &local_460) {
          operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_12();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      binlog::SessionWriter::addEvent<Getter>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 (long)local_7d8 * 1000000000 +
                 CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
                 (Getter *)local_7d8);
      in_RDX = extraout_RDX_03;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_13();
      in_RDX = extraout_RDX_15;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_14();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_e8._0_8_ = 0;
        local_e8._8_2_ = info;
        local_d8._M_p = (pointer)&local_c8;
        local_788 = this;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
        local_b8._M_p = (pointer)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
        local_98._M_p = (pointer)&local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_78 = 0x65;
        local_70._M_p = (pointer)&local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{}","");
        mserialize::CustomTag<app::Namespaced,_void>::tag_string();
        local_78f = local_78f & 0xffffff00;
        uStack_79f = CONCAT13(uStack_7cc,iStack_7d0._1_3_);
        uStack_791 = CONCAT11(local_7c8[8],local_7c8[7]);
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        uStack_797 = local_7c8._1_4_;
        local_50._M_p = (pointer)&local_40;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105070;
        local_e8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
        }
        this = local_788;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_15();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar12 = (long)local_7d8 * 1000000000;
      local_7d8._0_4_ = 3;
      binlog::SessionWriter::addEvent<app::Namespaced>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 lVar12 + CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
                 (Namespaced *)local_7d8);
      in_RDX = extraout_RDX_04;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_16();
      in_RDX = extraout_RDX_16;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_17();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_538._0_8_ = 0;
        local_538._8_2_ = info;
        local_528._M_p = (pointer)&local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"main","");
        local_508._M_p = (pointer)&local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"main","");
        local_4e8._M_p = (pointer)&local_4d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_4c8 = 0x68;
        local_4c0._M_p = (pointer)&local_4b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"{}","");
        mserialize::CustomTag<Private,_void>::tag_string();
        uStack_797 = uStack_797 & 0xffffff00;
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79f = (undefined4)(CONCAT14(uStack_7cc,iStack_7d0) >> 8);
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        local_4a0._M_p = (pointer)&local_490;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105077;
        local_538._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_538,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_p != &local_490) {
          operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_p != &local_4b0) {
          operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_p != &local_4d8) {
          operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_p != &local_4f8) {
          operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_p != &local_518) {
          operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_18();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar12 = (long)local_7d8 * 1000000000;
      local_7d8._0_4_ = 3;
      local_7d8._4_4_ = 4;
      binlog::SessionWriter::addEvent<Private>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 lVar12 + CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
                 (Private *)local_7d8);
      in_RDX = extraout_RDX_05;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_19();
      in_RDX = extraout_RDX_17;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_20();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_1a0._0_8_ = 0;
        local_1a0._8_2_ = info;
        local_190._M_p = (pointer)&local_180;
        local_788 = this;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
        local_170._M_p = (pointer)&local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
        local_150._M_p = (pointer)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_130 = 0x6b;
        local_128._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"{}","");
        mserialize::CustomTag<Triplet<int,_bool,_2UL>,_void>::tag_string();
        local_78b = 0;
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79f = (undefined4)(CONCAT14(uStack_7cc,iStack_7d0) >> 8);
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        uStack_797 = local_7c8._1_4_;
        uStack_791 = (undefined2)
                     (CONCAT13(local_7c8[8],CONCAT12(local_7c8[7],local_7c8._5_2_)) >> 0x10);
        local_78f = local_7c8._9_4_;
        local_108._M_p = (pointer)&local_f8;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_0010507e;
        local_1a0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != &local_118) {
          operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        this = local_788;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_21();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar14 = (long)local_7d8 * 1000000000;
      lVar12 = CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
      local_7d8._0_5_ = 0x100000001;
      iStack_7d0 = 2;
      uStack_7cc = 3;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      binlog::SessionWriter::addEvent<Triplet<int,bool,2ul>>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,lVar14 + lVar12,
                 (Triplet<int,_bool,_2UL> *)local_7d8);
      in_RDX = extraout_RDX_06;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_22();
      in_RDX = extraout_RDX_18;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_23();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_5f0._0_8_ = 0;
        local_5f0._8_2_ = info;
        local_5e0._M_p = (pointer)&local_5d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"main","");
        local_5c0._M_p = (pointer)&local_5b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"main","");
        local_5a0._M_p = (pointer)&local_590;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_580 = 0x6e;
        local_578._M_p = (pointer)&local_568;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"{}","");
        mserialize::CustomTag<first,_void>::tag_string();
        local_789 = 0;
        uStack_791 = CONCAT11(local_7c8[8],local_7c8[7]);
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79f = (undefined4)(CONCAT14(uStack_7cc,iStack_7d0) >> 8);
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        uStack_797 = local_7c8._1_4_;
        local_78f = local_7c8._9_4_;
        local_78b = (undefined1)local_7c8._13_2_;
        uStack_78a = SUB21(local_7c8._13_2_,1);
        local_558._M_p = (pointer)&local_548;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_558,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105085;
        local_5f0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_5f0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_p != &local_548) {
          operator_delete(local_558._M_p,local_548._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_p != &local_568) {
          operator_delete(local_578._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_p != &local_590) {
          operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_p != &local_5b0) {
          operator_delete(local_5c0._M_p,local_5b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_p != &local_5d0) {
          operator_delete(local_5e0._M_p,local_5d0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_24();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      binlog::SessionWriter::addEvent<first&>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 (long)local_7d8 * 1000000000 +
                 CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
                 (first *)&way);
      in_RDX = extraout_RDX_07;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_25();
      in_RDX = extraout_RDX_19;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_26();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_6a8._0_8_ = 0;
        local_6a8._8_2_ = info;
        local_698._M_p = (pointer)&local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"main","");
        local_678._M_p = (pointer)&local_668;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"main","");
        local_658._M_p = (pointer)&local_648;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_658,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_638 = 0x73;
        local_630._M_p = (pointer)&local_620;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"My foo: {}","");
        local_7d8._0_4_ = 1;
        puVar3 = local_7c8 + 8;
        iStack_7d0 = (int)puVar3;
        uStack_7cc = (undefined1)((ulong)puVar3 >> 0x20);
        uStack_7cb = (undefined2)((ulong)puVar3 >> 0x28);
        uStack_7c9 = (undefined1)((ulong)puVar3 >> 0x38);
        std::__cxx11::string::_M_construct<char_const*>((string *)&iStack_7d0,"two","");
        mserialize::CustomTag<Foo,_void>::tag_string();
        local_766 = 0;
        uStack_770 = CONCAT17(uStack_799,CONCAT25(uStack_79b,CONCAT41(uStack_79f,uStack_7a0)));
        local_778 = local_7a8;
        local_768 = CONCAT11((undefined1)uStack_797,local_798);
        local_610._M_p = (pointer)&local_600;
        sVar9 = strlen((char *)&local_778);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_610,&local_778,(long)&local_778.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_0010508c;
        local_6a8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_6a8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_p != &local_600) {
          operator_delete(local_610._M_p,local_600._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_p != &local_620) {
          operator_delete(local_630._M_p,local_620._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_p != &local_648) {
          operator_delete(local_658._M_p,local_648._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_p != &local_668) {
          operator_delete(local_678._M_p,local_668._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_p != &local_688) {
          operator_delete(local_698._M_p,local_688._M_allocated_capacity + 1);
        }
        puVar3 = (undefined1 *)
                 CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
        if (puVar3 != local_7c8 + 8) {
          operator_delete(puVar3,CONCAT17(local_7c8[0xf],
                                          CONCAT25(local_7c8._13_2_,
                                                   CONCAT41(local_7c8._9_4_,local_7c8[8]))) + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_27();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar14 = (long)local_7d8 * 1000000000;
      lVar12 = CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
      local_7d8._0_4_ = 1;
      puVar3 = local_7c8 + 8;
      iStack_7d0 = (int)puVar3;
      uStack_7cc = (undefined1)((ulong)puVar3 >> 0x20);
      uStack_7cb = (undefined2)((ulong)puVar3 >> 0x28);
      uStack_7c9 = (undefined1)((ulong)puVar3 >> 0x38);
      std::__cxx11::string::_M_construct<char_const*>((string *)&iStack_7d0,"two","");
      binlog::SessionWriter::addEvent<Foo>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,lVar14 + lVar12,
                 (Foo *)local_7d8);
      puVar4 = (undefined1 *)
               CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0)));
      in_RDX = extraout_RDX_08;
      if (puVar4 != puVar3) {
        operator_delete(puVar4,CONCAT17(local_7c8[0xf],
                                        CONCAT25(local_7c8._13_2_,
                                                 CONCAT41(local_7c8._9_4_,local_7c8[8]))) + 1);
        in_RDX = extraout_RDX_09;
      }
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_28();
      in_RDX = extraout_RDX_20;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar10 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8
                    );
          main_cold_29();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_760._0_8_ = 0;
        local_760._8_2_ = info;
        local_750._M_p = (pointer)&local_740;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"main","");
        local_730._M_p = (pointer)&local_720;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"main","");
        local_710._M_p = (pointer)&local_700;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_710,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                   ,"");
        local_6f0 = 0x79;
        local_6e8._M_p = (pointer)&local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"Hierarchy: {}","");
        mserialize::CustomTag<Derived,_void>::tag_string();
        local_78b = 0;
        local_7a8.a = local_7d8._0_4_;
        local_7a8.b = local_7d8._4_4_;
        uStack_7a0 = (undefined1)iStack_7d0;
        uStack_79f = (undefined4)(CONCAT14(uStack_7cc,iStack_7d0) >> 8);
        uStack_79b = uStack_7cb;
        uStack_799 = uStack_7c9;
        local_798 = local_7c8[0];
        uStack_797 = local_7c8._1_4_;
        uStack_791 = (undefined2)
                     (CONCAT13(local_7c8[8],CONCAT12(local_7c8[7],local_7c8._5_2_)) >> 0x10);
        local_78f = local_7c8._9_4_;
        local_6c8._M_p = (pointer)&local_6b8;
        sVar9 = strlen((char *)&local_7a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6c8,&local_7a8,(long)&local_7a8.a + sVar9);
        iVar7 = pthread_mutex_lock(ppVar1);
        if (iVar7 != 0) goto LAB_00105093;
        local_760._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_760,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._M_p != &local_6b8) {
          operator_delete(local_6c8._M_p,local_6b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e8._M_p != &local_6d8) {
          operator_delete(local_6e8._M_p,local_6d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_p != &local_700) {
          operator_delete(local_710._M_p,local_700._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_730._M_p != &local_720) {
          operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_750._M_p != &local_740) {
          operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar6.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar10 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
        main_cold_30();
      }
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 0;
      iStack_7d0 = 0;
      uStack_7cc = 0;
      uStack_7cb = 0;
      uStack_7c9 = 0;
      clock_gettime(0,(timespec *)local_7d8);
      lVar12 = (long)local_7d8 * 1000000000;
      uVar5 = CONCAT14(uStack_7cc,iStack_7d0);
      local_7d8._0_4_ = 0;
      local_7d8._4_4_ = 1;
      iStack_7d0 = 2;
      binlog::SessionWriter::addEvent<Derived>
                (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
                 lVar12 + CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,uVar5)),(Derived *)local_7d8);
      in_RDX = extraout_RDX_10;
    }
    binlog::consume<std::ostream>((ConsumeResult *)local_7d8,(binlog *)&std::cout,in_RDX);
    return 0;
  }
  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_00102f5b:
    aVar6.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar10 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
      main_cold_3();
    }
    local_7d8._0_4_ = 0;
    local_7d8._4_4_ = 0;
    iStack_7d0 = 0;
    uStack_7cc = 0;
    uStack_7cb = 0;
    uStack_7c9 = 0;
    clock_gettime(0,(timespec *)local_7d8);
    binlog::SessionWriter::addEvent<Empty>
              (this,(uint64_t)aVar6.super___atomic_base<unsigned_long>._M_i,
               (long)local_7d8 * 1000000000 +
               CONCAT17(uStack_7c9,CONCAT25(uStack_7cb,CONCAT14(uStack_7cc,iStack_7d0))),
               (Empty *)local_7d8);
    in_RDX = extraout_RDX;
    goto LAB_00102f9b;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar10 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar10,0x100000,0,(string *)local_7d8);
    main_cold_2();
  }
  ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
  local_258._0_8_ = 0;
  local_258._8_2_ = info;
  local_248._M_p = (pointer)&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"main","");
  local_228._M_p = (pointer)&local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"main","");
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
             ,"");
  local_1e8 = 0x59;
  local_1e0._M_p = (pointer)&local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"{}","");
  local_7a8 = (Private)((ulong)local_7a8.b._3_1_ << 0x38);
  local_7a8._0_6_ = 0x797400000000;
  local_7a8.a = 0x706d457b;
  local_778.a._0_2_ = 0x7d;
  cVar8 = mserialize::cx_strcat<6ul,1ul>((cx_string<6UL> *)&local_7a8,(cx_string<1UL> *)&local_778);
  local_7d8 = (undefined1  [8])((ulong)cVar8._data & 0xffffffffffffff);
  local_1c0._M_p = (pointer)&local_1b0;
  sVar9 = strlen(local_7d8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,local_7d8,local_7d8 + sVar9);
  iVar7 = pthread_mutex_lock(ppVar1);
  if (iVar7 == 0) {
    local_258._0_8_ = ppVar1[3].__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_258,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
    _Var2._M_i = ppVar1[3].__align;
    ppVar1[3].__align = _Var2._M_i + 1;
    pthread_mutex_unlock(ppVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_p != &local_1f8) {
      operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != &local_218) {
      operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != &local_238) {
      operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    goto LAB_00102f5b;
  }
  iVar7 = std::__throw_system_error(iVar7);
LAB_0010505b:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105062:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105069:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105070:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105077:
  iVar7 = std::__throw_system_error(iVar7);
LAB_0010507e:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105085:
  iVar7 = std::__throw_system_error(iVar7);
LAB_0010508c:
  iVar7 = std::__throw_system_error(iVar7);
LAB_00105093:
  uVar11 = std::__throw_system_error(iVar7);
  if (local_7d8 != (undefined1  [8])local_7c8) {
    operator_delete((void *)local_7d8,
                    CONCAT17(local_7c8[7],
                             CONCAT25(local_7c8._5_2_,CONCAT41(local_7c8._1_4_,local_7c8[0]))) + 1);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

int main()
{
  BINLOG_INFO("{}", Empty{});
  // Outputs: Empty

  BINLOG_INFO("{}", Single{123});
  // Outputs: Single{ a: 123 }

  BINLOG_INFO("{}", Pair{2, "three"});
  // Outputs: Pair{ a: 2, b: three }

  BINLOG_INFO("{}", Getter{});
  // Outputs: Getter{ a: 33, b: foo }

  BINLOG_INFO("{}", app::Namespaced{3});
  // Outputs: app::Namespaced{ a: 3, b: 2 }

  BINLOG_INFO("{}", Private{});
  // Outputs: Private{ a: 3, b: 4 }

  BINLOG_INFO("{}", Triplet<int, bool, 2>{1, true, {2,3}});
  // Outputs: Triplet{ a: 1, b: true, c: [2, 3] }

  BINLOG_INFO("{}", way);
  // Outputs: first{ business: first::First }

  //[mixed

  BINLOG_INFO("My foo: {}", Foo{1, "two"});
  // Outputs: My foo: Foo{ a: 1, b: two, c: true }
  //]

  //[derived

  BINLOG_INFO("Hierarchy: {}", Derived{});
  // Outputs: Hierarchy: Derived{ Base{ a: 0 }, b: 1, c: 2 }
  //]

  binlog::consume(std::cout);
  return 0;
}